

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MarkVarDeleted
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int var_index)

{
  size_type sVar1;
  uint in_ESI;
  size_type in_RDI;
  vector<bool,_std::allocator<bool>_> *in_stack_00000010;
  bool in_stack_00000067;
  size_type in_stack_00000068;
  vector<bool,_std::allocator<bool>_> *in_stack_00000070;
  _Bit_reference in_stack_ffffffffffffffe0;
  size_type __n;
  undefined4 in_stack_fffffffffffffff0;
  
  sVar1 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_00000010);
  __n = in_stack_ffffffffffffffe0._M_mask;
  if (sVar1 <= in_ESI) {
    std::
    vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
    ::capacity((vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                *)(in_RDI + 0x168));
    __n = in_stack_ffffffffffffffe0._M_mask;
    std::vector<bool,_std::allocator<bool>_>::reserve
              ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffe0._M_p,in_RDI);
    num_vars((BasicProblem<mp::BasicProblemParams<int>_> *)0x6b877e);
    std::vector<bool,_std::allocator<bool>_>::resize
              (in_stack_00000070,in_stack_00000068,in_stack_00000067);
  }
  std::vector<bool,_std::allocator<bool>_>::operator[]
            ((vector<bool,_std::allocator<bool>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),__n);
  std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffe0,true);
  return;
}

Assistant:

void MarkVarDeleted(int var_index) {
    if (is_var_deleted_.size() <= static_cast<unsigned>(var_index)) {
      is_var_deleted_.reserve(vars_.capacity());
      is_var_deleted_.resize(num_vars());
    }
    is_var_deleted_[var_index] = true;
  }